

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_deduc.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string _listinit_type;
  string _dbl_type;
  string _str_type;
  string _int_type;
  
  _int_type._M_dataplus._M_p = (pointer)&_int_type.field_2;
  _int_type._M_string_length = 0;
  _str_type._M_dataplus._M_p = (pointer)&_str_type.field_2;
  _str_type._M_string_length = 0;
  _int_type.field_2._M_local_buf[0] = '\0';
  _dbl_type._M_dataplus._M_p = (pointer)&_dbl_type.field_2;
  _dbl_type._M_string_length = 0;
  _listinit_type._M_dataplus._M_p = (pointer)&_listinit_type.field_2;
  _listinit_type._M_string_length = 0;
  _str_type.field_2._M_local_buf[0] = '\0';
  _dbl_type.field_2._M_local_buf[0] = '\0';
  _listinit_type.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&_int_type);
  std::__cxx11::string::assign((char *)&_dbl_type);
  strcmp(___libc_start_main + (*___libc_start_main == '*'),"PKc");
  std::__cxx11::string::assign((char *)&_str_type);
  std::__cxx11::string::assign((char *)&_listinit_type);
  poVar1 = std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<(poVar1,"\"_int\": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,9);
  poVar1 = std::operator<<(poVar1," is an ");
  poVar1 = std::operator<<(poVar1,(string *)&_int_type);
  poVar1 = std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<(poVar1,"\"_dbl\": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,9);
  poVar1 = std::operator<<(poVar1," is an ");
  poVar1 = std::operator<<(poVar1,(string *)&_dbl_type);
  poVar1 = std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<(poVar1,"\"_str\": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,9);
  poVar1 = std::operator<<(poVar1," is an ");
  poVar1 = std::operator<<(poVar1,(string *)&_str_type);
  poVar1 = std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<(poVar1,"\"_listinit\": ");
  poVar1 = std::operator<<(poVar1,"{\"List\", \"Init\"}");
  poVar1 = std::operator<<(poVar1," is an ");
  poVar1 = std::operator<<(poVar1,(string *)&_listinit_type);
  poVar1 = std::operator<<(poVar1,".\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&_listinit_type);
  std::__cxx11::string::~string((string *)&_dbl_type);
  std::__cxx11::string::~string((string *)&_str_type);
  std::__cxx11::string::~string((string *)&_int_type);
  return 0;
}

Assistant:

int main() {
	auto _int {9};
	auto _str {"Marc-Elie"};
	auto _dbl {23.5};
	//It's a shame std::initializer_list<> is not subscriptable :/
	auto _listinit = { "List", "Init"};
	std::string _int_type,_str_type,_dbl_type,_listinit_type;

	/* This solution is not portable across compilers--
		The result of std::type_info.name() is mangled
		on gcc and clang but IBM, Oracle, and MSVC
		provide human readable names. */

	if ( std::strcmp((typeid(_int).name()), "i") == 0 ) { _int_type = "int"; }
	else { _int_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_dbl).name()), "d") == 0 ) { _dbl_type = "double"; }
	else { _dbl_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_str).name()), "PKc") == 0 ) { _str_type = "std::string"; }
	else { _str_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_listinit).name()), "St16initializer_listIPKcE") == 0 ) 
		 { _listinit_type = "std::initializer_list<char const*>"; }
	else { _listinit_type = "unknown/non-gcc/clang compiler"; }

	//Print the values and their types
	std::cout << "\n"
		<<"\"_int\": " << _int << " is an " << _int_type << ".\n"
		<<"\"_dbl\": " << _int << " is an " << _dbl_type << ".\n"
		<<"\"_str\": " << _int << " is an " << _str_type << ".\n"
		<<"\"_listinit\": " << "{\"List\", \"Init\"}"<< " is an " << _listinit_type << ".\n"
		<<std::endl;
}